

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O2

UByteArray * __thiscall UByteArray::toHex(UByteArray *__return_storage_ptr__,UByteArray *this)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  int32_t i;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hex;
  
  hex._M_dataplus._M_p = (pointer)&hex.field_2;
  std::__cxx11::string::_M_construct((ulong)&hex,(char)(int)(this->d)._M_string_length * '\x02');
  for (lVar4 = 0; lVar4 < (int)(this->d)._M_string_length; lVar4 = lVar4 + 1) {
    bVar1 = (this->d)._M_dataplus._M_p[lVar4];
    cVar2 = '0';
    if (9 < (bVar1 & 0xf)) {
      cVar2 = 'W';
    }
    cVar3 = '0';
    if (0x9f < bVar1) {
      cVar3 = 'W';
    }
    hex._M_dataplus._M_p[lVar4 * 2] = cVar3 + (bVar1 >> 4);
    hex._M_dataplus._M_p[lVar4 * 2 + 1] = cVar2 + (bVar1 & 0xf);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&hex);
  std::__cxx11::string::~string((string *)&hex);
  return __return_storage_ptr__;
}

Assistant:

UByteArray toHex() {
        std::basic_string<char> hex(size() * 2, '\x00');
        for (int32_t i = 0; i < size(); i++) {
            uint8_t low  = d[i] & 0x0F;
            uint8_t high = (d[i] & 0xF0) >> 4;
            low += (low < 10 ? '0' : 'a' - 10);
            high += (high < 10 ? '0' : 'a' - 10);
            hex[2*i] = high;
            hex[2*i + 1] = low;
        }
        return UByteArray(hex);
    }